

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenLiteral * toBinaryenLiteral(BinaryenLiteral *__return_storage_ptr__,Literal x)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  HeapTypeKind HVar4;
  BinaryenLiteral *pBVar5;
  Literal *in_RSI;
  Name NVar6;
  HeapType local_28;
  HeapType heapType;
  
  uVar1 = (in_RSI->type).id;
  __return_storage_ptr__->type = uVar1;
  if ((uVar1 < 2) || ((uVar1 & 1) != 0 && 6 < uVar1)) {
    __assert_fail("x.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x37,"BinaryenLiteral toBinaryenLiteral(Literal)");
  }
  if (uVar1 < 7) {
    pBVar5 = (BinaryenLiteral *)
             (*(code *)(&DAT_00e3fcb8 + *(int *)(&DAT_00e3fcb8 + (ulong)((int)uVar1 - 2) * 4)))();
    return pBVar5;
  }
  if ((uVar1 & 1) == 0) {
    local_28 = wasm::Type::getHeapType(&in_RSI->type);
    if (local_28.id < 0x7d) {
      uVar3 = (uint)local_28.id & 0x7b;
      uVar3 = uVar3 << 0x1d | uVar3 - 8 >> 3;
      if (uVar3 - 10 < 5) {
        return __return_storage_ptr__;
      }
      switch(uVar3) {
      case 0:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x55);
      case 1:
      case 2:
      case 3:
      case 4:
      case 6:
      case 7:
      case 8:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5d);
      case 5:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x53);
      case 9:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5f);
      }
    }
    HVar4 = wasm::HeapType::getKind(&local_28);
    if (HVar4 == Func) {
      NVar6 = wasm::Literal::getFunc(in_RSI);
      (__return_storage_ptr__->field_1).i64 = (int64_t)NVar6.super_IString.str._M_str;
      return __return_storage_ptr__;
    }
    bVar2 = wasm::Type::isData(&in_RSI->type);
    if (bVar2) {
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0x6e);
    }
    __assert_fail("x.isData()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x6d,"BinaryenLiteral toBinaryenLiteral(Literal)");
  }
  __assert_fail("x.type.isRef()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x4e,"BinaryenLiteral toBinaryenLiteral(Literal)");
}

Assistant:

BinaryenLiteral toBinaryenLiteral(Literal x) {
  BinaryenLiteral ret;
  ret.type = x.type.getID();
  assert(x.type.isSingle());
  if (x.type.isBasic()) {
    switch (x.type.getBasic()) {
      case Type::i32:
        ret.i32 = x.geti32();
        return ret;
      case Type::i64:
        ret.i64 = x.geti64();
        return ret;
      case Type::f32:
        ret.i32 = x.reinterpreti32();
        return ret;
      case Type::f64:
        ret.i64 = x.reinterpreti64();
        return ret;
      case Type::v128:
        memcpy(&ret.v128, x.getv128Ptr(), 16);
        return ret;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(x.type.isRef());
  auto heapType = x.type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::any:
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        // Null.
        return ret;
    }
  }
  if (heapType.isSignature()) {
    ret.func = x.getFunc().str.data();
    return ret;
  }
  assert(x.isData());
  WASM_UNREACHABLE("TODO: gc data");
}